

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::StringStreamToString(stringstream *ss)

{
  long lVar1;
  char *pcVar2;
  string *in_RDI;
  char *ch;
  char *end;
  char *start;
  string *str;
  string *result;
  char *local_68;
  string local_38 [32];
  string *local_18;
  
  std::__cxx11::stringstream::str();
  local_18 = local_38;
  local_68 = (char *)std::__cxx11::string::c_str();
  lVar1 = std::__cxx11::string::length();
  pcVar2 = local_68 + lVar1;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (; local_68 != pcVar2; local_68 = local_68 + 1) {
    if (*local_68 == '\0') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\0");
    }
    else {
      std::__cxx11::string::operator+=((string *)in_RDI,*local_68);
    }
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  std::string result;
  result.reserve(2 * (end - start));
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      result += "\\0";  // Replaces NUL with "\\0";
    } else {
      result += *ch;
    }
  }

  return result;
}